

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  internal iVar1;
  uint id;
  internal *piVar2;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *this_00;
  internal *piVar3;
  basic_string_view<char> id_00;
  null_terminating_iterator<char> nVar4;
  null_terminating_iterator<char> local_20;
  
  this_00 = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
             *)it.end_;
  piVar3 = (internal *)it.ptr_;
  local_20.end_ = (char *)piVar3;
  local_20.ptr_ = (char *)this;
  if (this == piVar3) {
    iVar1 = (internal)0x0;
  }
  else {
    iVar1 = *this;
    if ((iVar1 == (internal)0x7d) || (iVar1 == (internal)0x3a)) {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::operator()(this_00);
      local_20.end_ = (char *)piVar3;
      goto LAB_0011cadf;
    }
    if ((byte)((char)iVar1 - 0x30U) < 10) {
      id = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>&>
                     (&local_20,this_00);
      if ((local_20.ptr_ == local_20.end_) ||
         (((internal)*local_20.ptr_ != (internal)0x3a &&
          ((internal)*local_20.ptr_ != (internal)0x7d)))) {
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
        ::on_error(this_00,"invalid format string");
      }
      else {
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
        ::operator()(this_00,id);
      }
      goto LAB_0011cadf;
    }
  }
  if ((iVar1 == (internal)0x5f) || ((byte)(((byte)iVar1 & 0xdf) + 0xbf) < 0x1a)) {
    id_00.size_ = 0;
    piVar2 = this + 1;
    do {
      local_20.ptr_ = (char *)piVar2;
      if ((internal *)local_20.ptr_ == piVar3) {
        iVar1 = (internal)0x0;
      }
      else {
        iVar1 = (internal)*local_20.ptr_;
      }
      piVar2 = (internal *)local_20.ptr_ + 1;
      id_00.size_ = id_00.size_ + 1;
    } while ((((byte)((char)iVar1 - 0x30U) < 10) || (iVar1 == (internal)0x5f)) ||
            ((byte)(((byte)iVar1 & 0xdf) + 0xbf) < 0x1a));
    id_00.data_ = (char *)this;
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(this_00,id_00);
    local_20.end_ = (char *)piVar3;
  }
  else {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
    ::on_error(this_00,"invalid format string");
    local_20.end_ = (char *)piVar3;
  }
LAB_0011cadf:
  nVar4.end_ = local_20.end_;
  nVar4.ptr_ = local_20.ptr_;
  return nVar4;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}